

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_frag_start(lws *wsi,int hdr_token_idx)

{
  byte bVar1;
  uint uVar2;
  allocated_headers *paVar3;
  lws *wsi_00;
  uint local_2c;
  int n;
  allocated_headers *ah;
  int hdr_token_idx_local;
  lws *wsi_local;
  
  paVar3 = (wsi->http).ah;
  if (paVar3 == (allocated_headers *)0x0) {
    _lws_log(4,"%s: no ah\n","lws_frag_start");
    wsi_local._4_4_ = 1;
  }
  else {
    paVar3->hdr_token_idx = -1;
    _lws_log(0x40,"%s: token %d ah->pos = %d, ah->nfrag = %d\n","lws_frag_start",
             (ulong)(uint)hdr_token_idx,(ulong)paVar3->pos,(ulong)paVar3->nfrag);
    if (hdr_token_idx == 0) {
      _lws_log(1,"%s: zero hdr_token_idx\n","lws_frag_start");
      wsi_local._4_4_ = 1;
    }
    else if (paVar3->nfrag < 0x5f) {
      if (((((hdr_token_idx == 0x23) || (hdr_token_idx == 0x24)) || (hdr_token_idx == 0x25)) ||
          ((hdr_token_idx == 0x55 || (hdr_token_idx == 0x26)))) &&
         ((paVar3->frag_index[hdr_token_idx] != '\0' &&
          ((paVar3->frags[paVar3->frag_index[hdr_token_idx]].flags & 1) == 0)))) {
        wsi_00 = lws_get_network_wsi(wsi);
        lws_h2_goaway(wsi_00,1,"Duplicated pseudoheader");
        wsi_local._4_4_ = 1;
      }
      else {
        if (paVar3->nfrag == '\0') {
          paVar3->nfrag = '\x01';
        }
        paVar3->frags[paVar3->nfrag].offset = paVar3->pos;
        paVar3->frags[paVar3->nfrag].len = 0;
        paVar3->frags[paVar3->nfrag].nfrag = '\0';
        paVar3->frags[paVar3->nfrag].flags = '\x02';
        paVar3->hdr_token_idx = hdr_token_idx;
        if (paVar3->frag_index[hdr_token_idx] == '\0') {
          paVar3->frag_index[hdr_token_idx] = paVar3->nfrag;
        }
        else {
          bVar1 = paVar3->frag_index[hdr_token_idx];
          while (local_2c = (uint)bVar1, paVar3->frags[(int)local_2c].nfrag != '\0') {
            bVar1 = paVar3->frags[(int)local_2c].nfrag;
          }
          paVar3->frags[(int)local_2c].nfrag = paVar3->nfrag;
          if (hdr_token_idx == 0x1a) {
            uVar2 = paVar3->pos;
            paVar3->pos = uVar2 + 1;
            paVar3->data[uVar2] = ';';
            paVar3->frags[paVar3->nfrag].len = paVar3->frags[paVar3->nfrag].len + 1;
          }
        }
        wsi_local._4_4_ = 0;
      }
    }
    else {
      _lws_log(1,"%s: frag index %d too big\n","lws_frag_start",(ulong)paVar3->nfrag);
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

static int lws_frag_start(struct lws *wsi, int hdr_token_idx)
{
	struct allocated_headers *ah = wsi->http.ah;

	if (!ah) {
		lwsl_notice("%s: no ah\n", __func__);
		return 1;
	}

	ah->hdr_token_idx = -1;

	lwsl_header("%s: token %d ah->pos = %d, ah->nfrag = %d\n",
		   __func__, hdr_token_idx, ah->pos, ah->nfrag);

	if (!hdr_token_idx) {
		lwsl_err("%s: zero hdr_token_idx\n", __func__);
		return 1;
	}

	if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frag_index)) {
		lwsl_err("%s: frag index %d too big\n", __func__, ah->nfrag);
		return 1;
	}

	if ((hdr_token_idx == WSI_TOKEN_HTTP_COLON_AUTHORITY ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_METHOD ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_PATH ||
	     hdr_token_idx == WSI_TOKEN_COLON_PROTOCOL ||
	     hdr_token_idx == WSI_TOKEN_HTTP_COLON_SCHEME) &&
	     ah->frag_index[hdr_token_idx]) {
		if (!(ah->frags[ah->frag_index[hdr_token_idx]].flags & 1)) {
			lws_h2_goaway(lws_get_network_wsi(wsi),
				      H2_ERR_PROTOCOL_ERROR,
				      "Duplicated pseudoheader");
			return 1;
		}
	}

	if (ah->nfrag == 0)
		ah->nfrag = 1;

	ah->frags[ah->nfrag].offset = ah->pos;
	ah->frags[ah->nfrag].len = 0;
	ah->frags[ah->nfrag].nfrag = 0;
	ah->frags[ah->nfrag].flags = 2; /* we had reason to set it */

	ah->hdr_token_idx = hdr_token_idx;

	/*
	 * Okay, but we could be, eg, the second or subsequent cookie: header
	 */

	if (ah->frag_index[hdr_token_idx]) {
		int n;

		/* find the last fragment for this header... */
		n = ah->frag_index[hdr_token_idx];
		while (ah->frags[n].nfrag)
			n = ah->frags[n].nfrag;
		/* and point it to continue in our continuation fragment */
		ah->frags[n].nfrag = ah->nfrag;

		/* cookie continuations need a separator token of ';' */
		if (hdr_token_idx == WSI_TOKEN_HTTP_COOKIE) {
			ah->data[ah->pos++] = ';';
			ah->frags[ah->nfrag].len++;
		}
	} else
		ah->frag_index[hdr_token_idx] = ah->nfrag;

	return 0;
}